

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_impl.h
# Opt level: O1

int secp256k1_scalar_set_b32_seckey(secp256k1_scalar *r,uchar *bin)

{
  int overflow;
  int local_1c;
  
  secp256k1_scalar_set_b32(r,bin,&local_1c);
  secp256k1_scalar_verify(r);
  secp256k1_scalar_verify(r);
  return (int)(*r != 0 && local_1c == 0);
}

Assistant:

static int secp256k1_scalar_set_b32_seckey(secp256k1_scalar *r, const unsigned char *bin) {
    int overflow;
    secp256k1_scalar_set_b32(r, bin, &overflow);

    SECP256K1_SCALAR_VERIFY(r);
    return (!overflow) & (!secp256k1_scalar_is_zero(r));
}